

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O2

void LEARNER::save(vw *all,example *ec)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  string final_regressor_name;
  string asStack_78 [32];
  string local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::__cxx11::string::string(asStack_78,(string *)&all->final_regressor_name);
  pcVar1 = (ec->tag)._begin;
  uVar3 = (long)(ec->tag)._end - (long)pcVar1;
  if ((5 < uVar3) && (pcVar1[4] == '_')) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar1 + 5,pcVar1 + uVar3);
    std::__cxx11::string::operator=(asStack_78,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (all->quiet == false) {
    poVar2 = std::operator<<(&(all->trace_message).super_ostream,"saving regressor to ");
    poVar2 = std::operator<<(poVar2,asStack_78);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string((string *)&local_58,asStack_78);
  save_predictor(all,&local_58,0);
  std::__cxx11::string::~string((string *)&local_58);
  VW::finish_example(all,ec);
  std::__cxx11::string::~string(asStack_78);
  return;
}

Assistant:

void save(vw& all, example* ec)
{
  // save state command
  string final_regressor_name = all.final_regressor_name;

  if ((ec->tag).size() >= 6 && (ec->tag)[4] == '_')
    final_regressor_name = string(ec->tag.begin() + 5, (ec->tag).size() - 5);

  if (!all.quiet)
    all.trace_message << "saving regressor to " << final_regressor_name << endl;
  save_predictor(all, final_regressor_name, 0);

  VW::finish_example(all, *ec);
}